

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * wasm::Literal::standardizeNaN(Literal *__return_storage_ptr__,Literal *input)

{
  uintptr_t uVar1;
  double dVar2;
  
  dVar2 = getFloat(input);
  if (NAN(dVar2)) {
    uVar1 = (input->type).id;
    if (uVar1 == 5) {
      (__return_storage_ptr__->field_0).i64 = 0x7ff8000000000000;
      (__return_storage_ptr__->type).id = 5;
    }
    else {
      if (uVar1 != 4) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                           ,0x13d);
      }
      (__return_storage_ptr__->field_0).i32 = 0x7fc00000;
      (__return_storage_ptr__->type).id = 4;
    }
  }
  else {
    Literal(__return_storage_ptr__,input);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::standardizeNaN(const Literal& input) {
  if (!std::isnan(input.getFloat())) {
    return input;
  }
  // Pick a simple canonical payload, and positive.
  if (input.type == Type::f32) {
    return Literal(bit_cast<float>(uint32_t(0x7fc00000u)));
  } else if (input.type == Type::f64) {
    return Literal(bit_cast<double>(uint64_t(0x7ff8000000000000ull)));
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
}